

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O0

bool __thiscall
r_exec::_Mem::load(_Mem *this,vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *objects,
                  uint64_t stdin_oid,uint64_t stdout_oid,uint64_t self_oid)

{
  uint64_t uVar1;
  char cVar2;
  uchar uVar3;
  bool bVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  reference ppCVar8;
  Code *pCVar9;
  size_type sVar10;
  Code *pCVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ModelBase *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  reference ppVVar12;
  undefined1 auVar13 [16];
  value_type local_a0;
  Group *local_98;
  Group *host;
  View *view;
  _Node_iterator_base<r_code::View_*,_true> local_80;
  _Node_iterator_base<r_code::View_*,_true> local_78;
  _Node_iterator_base<r_code::View_*,_true> local_70;
  const_iterator v;
  Atom local_54 [4];
  value_type local_50;
  Code *object;
  uint64_t i;
  uint64_t local_38;
  uint64_t self_oid_local;
  uint64_t stdout_oid_local;
  uint64_t stdin_oid_local;
  vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *objects_local;
  _Mem *this_local;
  
  uVar1 = this->time_tolerance;
  auVar13._8_4_ = (int)(uVar1 >> 0x20);
  auVar13._0_8_ = uVar1;
  auVar13._12_4_ = 0x45300000;
  local_38 = self_oid;
  self_oid_local = stdout_oid;
  stdout_oid_local = stdin_oid;
  stdin_oid_local = (uint64_t)objects;
  objects_local = (vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)this;
  r_code::Utils::SetReferenceValues
            (this->base_period,this->float_tolerance,
             (auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  ppCVar8 = std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::operator[]
                      ((vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)stdin_oid_local,0)
  ;
  core::P<r_exec::Group>::operator=(&this->_root,(Group *)*ppCVar8);
  pCVar9 = core::P::operator_cast_to_Code_((P *)&this->_root);
  store(this,pCVar9);
  i = (uint64_t)core::P::operator_cast_to_Group_((P *)&this->_root);
  std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::push_back
            (&this->initial_groups,(value_type *)&i);
  sVar10 = std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::size
                     ((vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)stdin_oid_local);
  (**(code **)(*(long *)this + 0x10))(this,sVar10 - 1);
  object = (Code *)0x1;
  do {
    pCVar9 = object;
    pCVar11 = (Code *)std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::size
                                ((vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)
                                 stdin_oid_local);
    if (pCVar11 <= pCVar9) {
      return true;
    }
    ppCVar8 = std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::operator[]
                        ((vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)stdin_oid_local,
                         (size_type)object);
    local_50 = (value_type)*ppCVar8;
    store(this,(Code *)local_50);
    iVar6 = (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
              .super_Code.super__Object._vptr__Object[2])();
    if (CONCAT44(extraout_var,iVar6) == stdout_oid_local) {
      ppCVar8 = std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::operator[]
                          ((vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)
                           stdin_oid_local,(size_type)object);
      this->_stdin = *ppCVar8;
    }
    else {
      iVar6 = (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                super_LObject.super_Code.super__Object._vptr__Object[2])();
      if (CONCAT44(extraout_var_00,iVar6) == self_oid_local) {
        ppCVar8 = std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::operator[]
                            ((vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)
                             stdin_oid_local,(size_type)object);
        this->_stdout = *ppCVar8;
      }
      else {
        iVar6 = (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[2])();
        if (CONCAT44(extraout_var_01,iVar6) == local_38) {
          ppCVar8 = std::vector<r_code::Code_*,_std::allocator<r_code::Code_*>_>::operator[]
                              ((vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)
                               stdin_oid_local,(size_type)object);
          this->_self = *ppCVar8;
        }
      }
    }
    (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
      super_Code.super__Object._vptr__Object[4])();
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x37) {
      iVar6 = (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                super_LObject.super_Code.super__Object._vptr__Object[9])();
      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x20))();
      sVar5 = r_code::Atom::asOpcode();
      if (sVar5 == Opcodes::Pgm) {
        iVar6 = (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[9])(local_50,0);
        iVar7 = (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[9])(local_50,0);
        (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar7) + 0x20))
                  ((long *)CONCAT44(extraout_var_04,iVar7),2);
        r_code::Atom::asIndex();
        (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0x20))();
        cVar2 = r_code::Atom::getAtomCount();
        if (cVar2 == '\0') {
          (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])();
          uVar3 = r_code::Atom::asOpcode();
          (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(local_50,0);
          r_code::Atom::getAtomCount();
          r_code::Atom::InstantiatedInputLessProgram((ushort)local_54,uVar3);
          iVar6 = (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                    super_LObject.super_Code.super__Object._vptr__Object[4])(local_50,0);
          r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar6),local_54);
          r_code::Atom::~Atom(local_54);
        }
      }
      else {
        (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[4])();
        uVar3 = r_code::Atom::asOpcode();
        (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[4])(local_50,0);
        r_code::Atom::getAtomCount();
        r_code::Atom::InstantiatedAntiProgram((ushort)&v,uVar3);
        iVar6 = (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[4])(local_50,0);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar6),(Atom *)&v);
        r_code::Atom::~Atom((Atom *)&v);
      }
    }
    else if (cVar2 == -0x33) {
      unpack_hlp(this,(Code *)local_50);
    }
    else if (cVar2 == -0x32) {
      unpack_hlp(this,(Code *)local_50);
      this_00 = ModelBase::Get();
      ModelBase::load(this_00,(Code *)local_50);
    }
    std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::_Node_const_iterator
              ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_70);
    local_80._M_cur =
         (__node_type *)
         std::
         unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
         ::begin(&(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.views);
    std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::_Node_const_iterator
              ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_78,
               (_Node_iterator<r_code::View_*,_true,_true> *)&local_80);
    local_70._M_cur = local_78._M_cur;
    while( true ) {
      view = (View *)std::
                     unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
                     ::end(&(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>
                            .super_LObject.super_Code.views);
      bVar4 = std::__detail::operator!=
                        (&local_70,(_Node_iterator_base<r_code::View_*,_true> *)&view);
      if (!bVar4) break;
      ppVVar12 = std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::operator*
                           ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_70);
      host = (Group *)*ppVVar12;
      View::set_object((View *)host,(Code *)local_50);
      local_98 = View::get_host((View *)host);
      bVar4 = Group::load(local_98,(View *)host,(Code *)local_50);
      if (!bVar4) {
        return false;
      }
      std::__detail::_Node_const_iterator<r_code::View_*,_true,_true>::operator++
                ((_Node_const_iterator<r_code::View_*,_true,_true> *)&local_70);
    }
    (*(local_50->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
      super_Code.super__Object._vptr__Object[4])(local_50,0);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x38) {
      local_a0 = local_50;
      std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::push_back
                (&this->initial_groups,&local_a0);
    }
    object = (Code *)((long)&(object->super__Object)._vptr__Object + 1);
  } while( true );
}

Assistant:

bool _Mem::load(std::vector<r_code::Code *> *objects, uint64_t stdin_oid, uint64_t stdout_oid, uint64_t self_oid)
{
    Utils::SetReferenceValues(base_period, float_tolerance, time_tolerance);
    // load root (always comes first).
    _root = (Group *)(*objects)[0];
    store((Code *)_root);
    initial_groups.push_back(_root);
    set_last_oid(objects->size() - 1);

    for (uint64_t i = 1; i < objects->size(); ++i) { // skip root as it has no initial views.
        Code *object = (*objects)[i];
        store(object);

        if (object->get_oid() == stdin_oid) {
            _stdin = (Group *)(*objects)[i];
        } else if (object->get_oid() == stdout_oid) {
            _stdout = (Group *)(*objects)[i];
        } else if (object->get_oid() == self_oid) {
            _self = (*objects)[i];
        }

        switch (object->code(0).getDescriptor()) {
        case Atom::MODEL:
            unpack_hlp(object);
            //object->add_reference(NULL); // classifier.
            ModelBase::Get()->load(object);
            break;

        case Atom::COMPOSITE_STATE:
            unpack_hlp(object);
            break;

        case Atom::INSTANTIATED_PROGRAM: // refine the opcode depending on the inputs and the program type.
            if (object->get_reference(0)->code(0).asOpcode() == Opcodes::Pgm) {
                if (object->get_reference(0)->code(object->get_reference(0)->code(PGM_INPUTS).asIndex()).getAtomCount() == 0) {
                    object->code(0) = Atom::InstantiatedInputLessProgram(object->code(0).asOpcode(), object->code(0).getAtomCount());
                }
            } else {
                object->code(0) = Atom::InstantiatedAntiProgram(object->code(0).asOpcode(), object->code(0).getAtomCount());
            }

            break;
        }

        std::unordered_set<r_code::View *, r_code::View::Hash, r_code::View::Equal>::const_iterator v;

        for (v = object->views.begin(); v != object->views.end(); ++v) {
            // init hosts' member_set.
            View *view = (r_exec::View *)*v;
            view->set_object(object);
            Group *host = view->get_host();

            if (!host->load(view, object)) {
                return false;
            }
        }

        if (object->code(0).getDescriptor() == Atom::GROUP) {
            initial_groups.push_back((Group *)object);    // convenience to create initial update jobs - see start().
        }
    }

    return true;
}